

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O3

void __thiscall inipp::Ini<wchar_t>::Ini(Ini<wchar_t> *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  p_Var1 = &(this->sections)._M_t._M_impl.super__Rb_tree_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00113c58;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_is_section_start_00113ca8;
  p_Var2[1]._M_use_count = 0x5b;
  p_Var2[1]._M_weak_count = 0x5d;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x3b0000003d;
  p_Var2[2]._M_use_count = 0x24;
  p_Var2[2]._M_weak_count = 0x7b;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x7d0000003a;
  (this->format).super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (this->format).super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  return;
}

Assistant:

Ini() : format(std::make_shared<Format<CharT>>()) {}